

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessGenPointModeQueryCase::iterate
          (TessGenPointModeQueryCase *this)

{
  TestLog *pTVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  TestContext *pTVar3;
  int iVar4;
  undefined4 extraout_var;
  Context *pCVar5;
  undefined8 uVar6;
  string *code;
  char *globalLayouts;
  char *globalLayouts_00;
  long lVar7;
  long lVar8;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  ShaderProgram program;
  Context *local_3e8;
  TestContext *local_3e0;
  Context local_3d8;
  Context *local_3c0;
  TestContext *local_3b8;
  Context local_3b0;
  TestContext *local_398;
  value_type local_390;
  TestContext *local_370;
  value_type local_368;
  uint local_348 [2];
  value_type local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  uint local_2a0;
  value_type local_298;
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  CallLogWrapper local_238;
  undefined1 local_220 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_190;
  undefined1 local_170 [32];
  ResultCollector local_150;
  undefined1 local_100 [152];
  GLuint local_68;
  bool local_40;
  
  pTVar1 = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_150,pTVar1,(string *)local_100);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  iVar4 = (*((this->super_TessProgramQueryCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_238,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log);
  checkTessellationSupport((this->super_TessProgramQueryCase).super_TestCase.m_context);
  local_238.m_enableLog = true;
  uVar6 = CONCAT71((int7)((ulong)&local_238 >> 8),1);
  lVar8 = 0;
  do {
    local_3d8.m_contextInfo._4_4_ = (uint)uVar6;
    pTVar1 = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Type","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_220,iterate::s_modes[lVar8].description,(allocator<char> *)local_348)
    ;
    code = (string *)local_220;
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_3b0.m_contextInfo,pTVar1,(string *)local_100,
               (string *)local_220);
    if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    renderCtx = pCVar2->m_renderCtx;
    memset((string *)local_220,0,0xac);
    local_170._0_8_ = (pointer)0x0;
    local_170[8] = 0;
    local_170._9_7_ = 0;
    local_170[0x10] = 0;
    local_170._17_8_ = 0;
    local_370 = (TestContext *)0x75;
    local_3e8 = &local_3d8;
    pCVar5 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_3e8,(ulong)&local_370);
    pTVar3 = local_370;
    local_3d8.m_testCtx = local_370;
    local_3e8 = pCVar5;
    memcpy(pCVar5,
           "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(float(gl_VertexID), float(gl_VertexID / 2), 0.0, 1.0);\n}\n"
           ,0x75);
    local_3e0 = pTVar3;
    *(undefined1 *)((long)&pTVar3->m_platform + (long)&pCVar5->m_testCtx) = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2c0,(_anonymous_namespace_ *)pCVar2->m_renderCtx,local_3e8,(char *)code);
    local_348[0] = 0;
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340,local_2c0._M_dataplus._M_p,
               local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + (ulong)local_348[0] * 0x18),&local_340);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    local_3c0 = &local_3b0;
    local_398 = (TestContext *)0x7f;
    pCVar5 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_3c0,(ulong)&local_398);
    pTVar3 = local_398;
    local_3b0.m_testCtx = local_398;
    local_3c0 = pCVar5;
    memcpy(pCVar5,
           "${GLSL_VERSION_DECL}\nlayout (location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n}\n"
           ,0x7f);
    local_3b8 = pTVar3;
    *(undefined1 *)((long)&pTVar3->m_platform + (long)&pCVar5->m_testCtx) = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2e0,(_anonymous_namespace_ *)pCVar2->m_renderCtx,local_3c0,(char *)code);
    local_370 = (TestContext *)CONCAT44(local_370._4_4_,1);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,local_2e0._M_dataplus._M_p,
               local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + ((ulong)local_370 & 0xffffffff) * 0x18),&local_368);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    (anonymous_namespace)::TessProgramQueryCase::getTessCtrlSource_abi_cxx11_
              ((string *)local_258,"layout(vertices=6) out",globalLayouts);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_300,(_anonymous_namespace_ *)pCVar2->m_renderCtx,(Context *)local_258._0_8_,
               (char *)code);
    local_398 = (TestContext *)CONCAT44(local_398._4_4_,3);
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_390,local_300._M_dataplus._M_p,
               local_300._M_dataplus._M_p + local_300._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + ((ulong)local_398 & 0xffffffff) * 0x18),&local_390);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    (anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
              ((string *)local_278,iterate::s_modes[lVar8].layout,globalLayouts_00);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_320,(_anonymous_namespace_ *)pCVar2->m_renderCtx,(Context *)local_278._0_8_,
               (char *)code);
    local_2a0 = 4;
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_320._M_dataplus._M_p,
               local_320._M_dataplus._M_p + local_320._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + (ulong)local_2a0 * 0x18),&local_298);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)local_100,renderCtx,(ProgramSources *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((Context *)local_278._0_8_ != (Context *)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((Context *)local_258._0_8_ != (Context *)(local_258 + 0x10)) {
      operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,(ulong)((long)&(local_3b0.m_testCtx)->m_platform + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,(ulong)((long)&(local_3d8.m_testCtx)->m_platform + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_170);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_190);
    lVar7 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + lVar7));
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
    glu::operator<<(((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode
                    .m_testCtx)->m_log,(ShaderProgram *)local_100);
    if (local_40 == false) {
      local_220._0_8_ = local_220 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"failed to build program","");
      tcu::ResultCollector::fail(&local_150,(string *)local_220);
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
      }
    }
    else {
      gls::StateQueryUtil::verifyStateProgramInteger
                (&local_150,&local_238,local_68,0x8e79,iterate::s_modes[lVar8].mode,
                 QUERY_PROGRAM_INTEGER);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
    tcu::TestLog::endSection((TestLog *)local_3b0.m_contextInfo);
    lVar8 = 1;
    uVar6 = 0;
  } while ((local_3d8.m_contextInfo._4_4_ & 1) != 0);
  tcu::ResultCollector::setTestContextResult
            (&local_150,
             (this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx);
  glu::CallLogWrapper::~CallLogWrapper(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.m_message._M_dataplus._M_p != &local_150.m_message.field_2) {
    operator_delete(local_150.m_message._M_dataplus._M_p,
                    local_150.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.m_prefix._M_dataplus._M_p != &local_150.m_prefix.field_2) {
    operator_delete(local_150.m_prefix._M_dataplus._M_p,
                    local_150.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

TessGenPointModeQueryCase::IterateResult TessGenPointModeQueryCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	static const struct
	{
		const char* description;
		const char* layout;
		glw::GLenum mode;
	} s_modes[] =
	{
		{ "Default mode",	"layout(triangles) in",			GL_FALSE	},
		{ "Point mode",		"layout(triangles, point_mode) in",		GL_TRUE		},
	};

	checkTessellationSupport(m_context);
	gl.enableLogging(true);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_modes); ++ndx)
	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Type", s_modes[ndx].description);

		glu::ShaderProgram program (m_context.getRenderContext(), glu::ProgramSources()
																	<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																	<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																	<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource("layout(vertices=6) out").c_str()))
																	<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource(s_modes[ndx].layout).c_str())));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			result.fail("failed to build program");
		else
			verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, s_modes[ndx].mode, QUERY_PROGRAM_INTEGER);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}